

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

bool dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::_removeBidirectionalEdge
               (LLVMNode *ths,LLVMNode *n,EdgesT *ths_cont,EdgesT *n_cont)

{
  size_t sVar1;
  DGContainer<dg::LLVMNode_*,_4U> *in_RCX;
  byte bVar2;
  bool ret1;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  
  sVar1 = DGContainer<dg::LLVMNode_*,_4U>::erase
                    (in_RCX,(LLVMNode *)
                            CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  bVar2 = sVar1 != 0;
  DGContainer<dg::LLVMNode_*,_4U>::erase
            (in_RCX,(LLVMNode *)CONCAT17(bVar2,in_stack_ffffffffffffffd8));
  return (bool)(bVar2 & 1);
}

Assistant:

static bool _removeBidirectionalEdge(NodeT *ths, NodeT *n, EdgesT &ths_cont,
                                         EdgesT &n_cont) {
        bool ret1 = n_cont.erase(ths);
#ifndef NDEBUG
        bool ret2 =
#endif
                ths_cont.erase(n);

        // must have both or none
        assert(ret1 == ret2 && "An edge without rev. or vice versa");

        return ret1;
    }